

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

string * tinyusdz::value::print_strided_array_snipped<short>
                   (string *__return_storage_ptr__,uint8_t *vals,size_t stride_bytes,size_t n,
                   size_t N)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  size_t i_1;
  size_t sVar3;
  short *psVar4;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((stride_bytes & 0xfffffffffffffffd) == 0) {
    print_array_snipped<short>(__return_storage_ptr__,(short *)vals,n,N);
  }
  else {
    if (N == 0 || n <= N * 2) {
      ::std::operator<<(local_1a8,"[");
      for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
        if (sVar3 != 0) {
          ::std::operator<<(local_1a8,", ");
        }
        ::std::ostream::operator<<(local_1a8,*(short *)vals);
        vals = (uint8_t *)((long)vals + stride_bytes);
      }
    }
    else {
      uVar1 = n - N;
      if (n < N) {
        N = n;
      }
      ::std::operator<<(local_1a8,"[");
      psVar4 = (short *)vals;
      for (uVar2 = 0; N != uVar2; uVar2 = uVar2 + 1) {
        if (uVar2 != 0) {
          ::std::operator<<(local_1a8,", ");
        }
        ::std::ostream::operator<<(local_1a8,*psVar4);
        psVar4 = (short *)((long)psVar4 + stride_bytes);
      }
      if (N < uVar1) {
        N = uVar1;
      }
      ::std::operator<<(local_1a8,", ..., ");
      psVar4 = (short *)(vals + stride_bytes * N);
      for (uVar1 = N; uVar1 < n; uVar1 = uVar1 + 1) {
        if (N < uVar1) {
          ::std::operator<<(local_1a8,", ");
        }
        ::std::ostream::operator<<(local_1a8,*psVar4);
        psVar4 = (short *)((long)psVar4 + stride_bytes);
      }
    }
    ::std::operator<<(local_1a8,"]");
    ::std::__cxx11::stringbuf::str();
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_strided_array_snipped(const uint8_t *vals, size_t stride_bytes, const size_t n, size_t N = 16) {
  std::stringstream os;

  if ((stride_bytes == 0) || (stride_bytes == sizeof(T))) { // tightly packed.
    return print_array_snipped(reinterpret_cast<const T*>(vals), n, N);
  }

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << "]";
  }
  return os.str();
}